

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_predictor_32x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint8_t uVar4;
  int iVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  auVar3 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*(undefined1 (*) [32])above);
  auVar1 = vpaddq_avx(auVar3._16_16_,auVar3._0_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar7 = auVar1;
  dc_sum_64(left);
  auVar1 = vpaddw_avx(auVar7,auVar1);
  auVar1 = vpaddw_avx(auVar1,auVar2);
  uVar4 = (uint8_t)((auVar1._0_4_ + 0x30U & 0xffff) / 0x60);
  iVar5 = 0x40;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    *dst = uVar4;
    dst[1] = uVar4;
    dst[2] = uVar4;
    dst[3] = uVar4;
    dst[4] = uVar4;
    dst[5] = uVar4;
    dst[6] = uVar4;
    dst[7] = uVar4;
    dst[8] = uVar4;
    dst[9] = uVar4;
    dst[10] = uVar4;
    dst[0xb] = uVar4;
    dst[0xc] = uVar4;
    dst[0xd] = uVar4;
    dst[0xe] = uVar4;
    dst[0xf] = uVar4;
    dst[0x10] = uVar4;
    dst[0x11] = uVar4;
    dst[0x12] = uVar4;
    dst[0x13] = uVar4;
    dst[0x14] = uVar4;
    dst[0x15] = uVar4;
    dst[0x16] = uVar4;
    dst[0x17] = uVar4;
    dst[0x18] = uVar4;
    dst[0x19] = uVar4;
    dst[0x1a] = uVar4;
    dst[0x1b] = uVar4;
    dst[0x1c] = uVar4;
    dst[0x1d] = uVar4;
    dst[0x1e] = uVar4;
    dst[0x1f] = uVar4;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_32x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_32(above);
  __m256i sum_left = dc_sum_64(left);
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 48;
  sum /= 96;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_32xh(&row, 64, dst, stride);
}